

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_cmd.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  int w;
  int h;
  Rasterizer *pRVar5;
  long lVar6;
  int iVar7;
  CmdLine cmd;
  double local_c8 [5];
  char *local_a0;
  double local_98;
  double dStack_90;
  Image image;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  cmd.argc = argc;
  cmd.argv = argv;
  bVar4 = CmdLine::hasKey(&cmd,"--help");
  if ((((bVar4) || (bVar4 = CmdLine::hasKey(&cmd,"--width"), !bVar4)) ||
      (bVar4 = CmdLine::hasKey(&cmd,"--height"), !bVar4)) ||
     (bVar4 = CmdLine::hasKey(&cmd,"--output"), !bVar4)) {
    puts("Usage: b2drefras --width=W --height=H --output=file.bmp X Y X Y X Y [...]");
    iVar7 = 1;
  }
  else {
    w = CmdLine::intValueOf(&cmd,"--width");
    h = CmdLine::intValueOf(&cmd,"--height");
    bVar4 = CmdLine::hasKey(&cmd,"--even-odd");
    local_a0 = CmdLine::valueOf(&cmd,"--output");
    image._width = 0;
    image._height = 0;
    image._stride = 0;
    image._data = (uint8_t *)0x0;
    Image::create(&image,w,h);
    iVar7 = 0;
    Image::fillAll(&image,0);
    pRVar5 = Rasterizer::newById(&image,1,0);
    pRVar5->_fillMode = (uint)!bVar4;
    for (lVar6 = 1; lVar6 < argc; lVar6 = lVar6 + 1) {
      pcVar1 = argv[lVar6];
      if ((*pcVar1 != '-') || (pcVar1[1] != '-')) {
        dVar2 = atof(pcVar1);
        local_c8[iVar7] = dVar2;
        dVar3 = local_c8[3];
        dVar2 = local_c8[2];
        if (iVar7 == 3) {
          if ((((double)w < local_c8[2]) || (local_c8[2] < 0.0)) ||
             ((local_c8[3] < 0.0 || ((double)h < local_c8[3])))) {
LAB_001025cf:
            puts("Coordinates out of range");
            goto LAB_001025db;
          }
          local_58 = local_c8[0];
          dStack_50 = local_c8[1];
          local_48 = local_c8[2];
          dStack_40 = local_c8[3];
          (*pRVar5->_vptr_Rasterizer[4])(pRVar5,&local_58,2);
          local_c8[0] = dVar2;
          local_c8[1] = dVar3;
          iVar7 = 2;
        }
        else if (iVar7 == 1) {
          local_98 = local_c8[0];
          dStack_90 = local_c8[1];
          if (((((double)w < local_c8[0]) || (local_c8[0] < 0.0)) || (local_c8[1] < 0.0)) ||
             (iVar7 = 2, (double)h < local_c8[1])) goto LAB_001025cf;
        }
        else {
          iVar7 = iVar7 + 1;
        }
      }
    }
    if (1 < iVar7) {
      local_58 = local_c8[0];
      dStack_50 = local_c8[1];
      local_48 = local_98;
      dStack_40 = dStack_90;
      (*pRVar5->_vptr_Rasterizer[4])(pRVar5,&local_58,2);
    }
    (*pRVar5->_vptr_Rasterizer[5])(pRVar5,0xffffffffffffffff);
    (*pRVar5->_vptr_Rasterizer[1])(pRVar5);
    pcVar1 = local_a0;
    bVar4 = Image::writeBmp(&image,local_a0);
    iVar7 = 0;
    if (!bVar4) {
      printf("Cannot open file \'%s\' for writing\n",pcVar1);
LAB_001025db:
      iVar7 = 1;
    }
    free(image._data);
  }
  return iVar7;
}

Assistant:

int main(int argc, char* argv[]) {
  CmdLine cmd(argc, argv);
  int i;

  if (cmd.hasKey("--help") ||
     !cmd.hasKey("--width") ||
     !cmd.hasKey("--height") ||
     !cmd.hasKey("--output")) {
    printf("Usage: b2drefras --width=W --height=H --output=file.bmp X Y X Y X Y [...]\n");
    return 1;
  }

  int w = cmd.intValueOf("--width");
  int h = cmd.intValueOf("--height");
  bool nonZero = !cmd.hasKey("--even-odd");
  const char* fileName = cmd.valueOf("--output");

  uint32_t color = 0xFFFFFFFF;

  Image image;
  image.create(w, h);
  image.fillAll(0);

  // Rasterize the polygon.
  Rasterizer* ras = Rasterizer::newById(image, Rasterizer::kIdA1, 0);
  ras->setFillMode(nonZero ? Rasterizer::kFillNonZero : Rasterizer::kFillEvenOdd);

  double line[4];
  double start[2];
  int index = 0;

  for (i = 1; i < argc; i++) {
    const char* value = argv[i];
    if (value[0] == '-' && value[1] == '-')
      continue;

    // Initial point, required to close the polygon.
    line[index++] = atof(value);
    if (index == 2) {
      double x0 = line[0];
      double y0 = line[1];

      start[0] = x0;
      start[1] = y0;

      if (x0 < 0 || y0 < 0 || x0 > w || y0 > h) {
        printf("Coordinates out of range\n");
        return 1;
      }
    }

    if (index == 4) {
      double x0 = line[0];
      double y0 = line[1];
      double x1 = line[2];
      double y1 = line[3];

      if (x1 < 0 || y1 < 0 || x1 > w || y1 > h) {
        printf("Coordinates out of range\n");
        return 1;
      }

      Point poly[] = { { x0, y0 }, { x1, y1 } };
      ras->addPoly(poly, 2);

      line[0] = x1;
      line[1] = y1;
      index = 2;
    }
  }

  // Close the polygon
  if (index >= 2) {
    double x0 = line[0];
    double y0 = line[1];
    double x1 = start[0];
    double y1 = start[1];

    Point poly[] = { { x0, y0 }, { x1, y1 } };
    ras->addPoly(poly, 2);
  }

  ras->render(color);
  delete ras;

  if (!image.writeBmp(fileName)) {
    printf("Cannot open file '%s' for writing\n", fileName);
    return 1;
  }

  return 0;
}